

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O2

void __thiscall QLabelPrivate::linkHovered(QLabelPrivate *this,QString *anchor)

{
  QWidget *this_00;
  bool bVar1;
  ushort uVar2;
  long in_FS_OFFSET;
  QCursor local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  if ((anchor->d).size == 0) {
    if ((*(ushort *)&this->field_0x340 & 0x40) == 0) {
      QWidget::unsetCursor(this_00);
    }
    else {
      QWidget::setCursor(this_00,&this->cursor);
    }
    uVar2 = *(ushort *)&this->field_0x340 & 0xff7f;
  }
  else {
    if ((char)*(ushort *)&this->field_0x340 < '\0') goto LAB_003e5e60;
    bVar1 = QWidget::testAttribute_helper(this_00,WA_SetCursor);
    *(ushort *)&this->field_0x340 =
         (ushort)*(undefined4 *)&this->field_0x340 & 0xffbf | (ushort)bVar1 << 6;
    if (bVar1) {
      QWidget::cursor((QWidget *)&local_30);
      QCursor::operator=(&this->cursor,&local_30);
      QCursor::~QCursor(&local_30);
    }
    QCursor::QCursor(&local_30,PointingHandCursor);
    QWidget::setCursor(this_00,&local_30);
    QCursor::~QCursor(&local_30);
    uVar2 = (ushort)*(undefined4 *)&this->field_0x340 | 0x80;
  }
  *(ushort *)&this->field_0x340 = uVar2;
LAB_003e5e60:
  QLabel::linkHovered((QLabel *)this_00,anchor);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::linkHovered(const QString &anchor)
{
    Q_Q(QLabel);
#ifndef QT_NO_CURSOR
    if (anchor.isEmpty()) { // restore cursor
        if (validCursor)
            q->setCursor(cursor);
        else
            q->unsetCursor();
        onAnchor = false;
    } else if (!onAnchor) {
        validCursor = q->testAttribute(Qt::WA_SetCursor);
        if (validCursor) {
            cursor = q->cursor();
        }
        q->setCursor(Qt::PointingHandCursor);
        onAnchor = true;
    }
#endif
    emit q->linkHovered(anchor);
}